

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLimitsRenderingBase::iterate(GeometryShaderLimitsRenderingBase *this)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLenum GVar5;
  code *pcVar6;
  int iVar7;
  deUint32 dVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  reference pvVar10;
  undefined4 local_4c;
  undefined4 local_48;
  GLuint n_vertices;
  GLenum primitive_type;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_image;
  Functions *gl;
  GeometryShaderLimitsRenderingBase *this_local;
  
  initTest(this);
  pRVar9 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar7 = (*pRVar9->_vptr_RenderContext[3])();
  result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar7);
  GVar1 = this->m_texture_width;
  GVar2 = this->m_texture_height;
  GVar3 = this->m_texture_pixel_size;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
             (ulong)(GVar1 * GVar2 * GVar3),&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  (**(code **)(result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x1680))
            (this->m_program_object_id);
  dVar8 = (**(code **)(result_image.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar8,"Could not use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x476);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])();
  (**(code **)(result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x1c0))(0,0,0);
  (**(code **)(result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x188))(0x4000);
  dVar8 = (**(code **)(result_image.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar8,"Could not clear the color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x47e);
  local_48 = 0;
  local_4c = 1;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
            (this,&local_48,&local_4c);
  (**(code **)(result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 0x538))(local_48,0,local_4c);
  dVar8 = (**(code **)(result_image.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar8,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x487);
  pcVar6 = *(code **)(result_image.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x1220);
  GVar1 = this->m_texture_width;
  GVar2 = this->m_texture_height;
  GVar4 = this->m_texture_read_format;
  GVar5 = this->m_texture_read_type;
  pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  (*pcVar6)(0,0,GVar1,GVar2,GVar4,GVar5,pvVar10);
  dVar8 = (**(code **)(result_image.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 0x800))();
  glu::checkError(dVar8,"Could not read back pixels from color buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x48d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
  iVar7 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])();
  if (((byte)iVar7 & 1) == 1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShaderLimitsRenderingBase::iterate()
{
	initTest();

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Variables used for image verification purposes */
	std::vector<unsigned char> result_image(m_texture_width * m_texture_height * m_texture_pixel_size);

	/* Render */
	gl.useProgram(m_program_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program");

	/* Let child class prepare input for program */
	prepareProgramInput();

	gl.clearColor(0 /* red */, 0 /* green */, 0 /* blue */, 0 /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not clear the color buffer");

	/* Get draw call details from child class */
	glw::GLenum primitive_type = GL_POINTS;
	glw::GLuint n_vertices	 = 1;

	getDrawCallDetails(primitive_type, n_vertices);

	gl.drawArrays(primitive_type, 0 /* first */, n_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");

	/* Extract image from FBO */
	gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, m_texture_read_format, m_texture_read_type,
				  &result_image[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read back pixels from color buffer");

	/* Run verification */
	if (true == verifyResult(&result_image[0]))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Let child class clean itself */
	clean();

	return STOP;
}